

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O0

RK_S32 __thiscall
VpuApiLegacy::encoder_sendframe
          (VpuApiLegacy *this,VpuCodecContext *ctx,EncInputStream_t *aEncInStrm)

{
  RK_U32 width_00;
  RK_U32 height_00;
  RK_U32 fd_00;
  uint uVar1;
  RK_S64 RVar2;
  uint uVar3;
  uint uVar4;
  MppFrameFormat MVar5;
  int iVar6;
  RK_U8 *dst;
  MppMeta meta_00;
  MppMeta meta;
  MppBuffer buffer_1;
  undefined8 uStack_88;
  RK_U32 align_size;
  MppBuffer buffer;
  MppBufferInfo inputCommit;
  MppFrame frame;
  RK_U32 size;
  RK_S32 fd;
  RK_S64 pts;
  RK_U32 ver_stride;
  RK_U32 hor_stride;
  RK_U32 height;
  RK_U32 width;
  RK_S32 ret;
  EncInputStream_t *aEncInStrm_local;
  VpuCodecContext *ctx_local;
  VpuApiLegacy *this_local;
  
  if ((vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","encoder_sendframe");
  }
  width_00 = ctx->width;
  height_00 = ctx->height;
  uVar3 = width_00 + 0xf & 0xfffffff0;
  uVar4 = height_00 + 7 & 0xfffffff8;
  RVar2 = aEncInStrm->timeUs;
  fd_00 = aEncInStrm->bufPhyAddr;
  uVar1 = aEncInStrm->size;
  inputCommit.fd = 0;
  inputCommit.index = 0;
  height = mpp_frame_init(&inputCommit.fd);
  if (height != 0) {
    _mpp_log_l(2,"vpu_api_legacy","mpp_frame_init failed\n","encoder_sendframe");
    goto LAB_0010a4b7;
  }
  mpp_frame_set_width(inputCommit._32_8_,width_00);
  mpp_frame_set_height(inputCommit._32_8_,height_00);
  mpp_frame_set_ver_stride(inputCommit._32_8_,uVar4);
  mpp_frame_set_pts(inputCommit._32_8_,RVar2);
  MVar5 = this->format & 0xfffff;
  if ((MVar5 == MPP_FMT_YUV420SP) || (MVar5 - MPP_FMT_YUV420P < 2)) {
    mpp_frame_set_hor_stride(inputCommit._32_8_,uVar3);
  }
  else if (MVar5 - MPP_FMT_RGB565 < 4) {
    mpp_frame_set_hor_stride(inputCommit._32_8_,uVar3 << 1);
  }
  else if (MVar5 - MPP_FMT_RGB888 < 2) {
    mpp_frame_set_hor_stride(inputCommit._32_8_,uVar3 * 3);
  }
  else if (MVar5 - MPP_FMT_ARGB8888 < 4) {
    mpp_frame_set_hor_stride(inputCommit._32_8_,uVar3 << 2);
  }
  else {
    _mpp_log_l(2,"vpu_api_legacy","unsupport format 0x%x\n",0,this->format & 0xfffff);
  }
  mpp_frame_set_fmt(inputCommit._32_8_);
  if (aEncInStrm->nFlags != 0) {
    _mpp_log_l(4,"vpu_api_legacy","found eos true\n","encoder_sendframe");
    mpp_frame_set_eos(inputCommit._32_8_);
  }
  if (uVar1 == 0) {
    mpp_frame_set_buffer(inputCommit._32_8_,0);
    if (aEncInStrm->nFlags == 0) {
      _mpp_log_l(2,"vpu_api_legacy","found empty frame without eos flag set!\n","encoder_sendframe")
      ;
    }
  }
  else {
    if (this->fd_input < 0) {
      iVar6 = is_valid_dma_fd(fd_00);
      this->fd_input = iVar6;
    }
    if (this->fd_input == 0) {
      buffer_1._4_4_ = 0;
      if (aEncInStrm->buf == (RK_U8 *)0x0) {
        height = 0xfffffffd;
        goto LAB_0010a4b7;
      }
      if (((int)this->format < 0) || (0x13 < (int)this->format)) {
        if (((int)this->format < 5) || (0x13 < (int)this->format)) {
          if (((int)this->format < 0x10000) || (0x10006 < (int)this->format)) {
            if (((int)this->format < 0x10008) || (0x1000f < (int)this->format)) {
              _mpp_log_l(2,"vpu_api_legacy","unsupport input format:%d\n","encoder_sendframe",
                         this->format);
              height = 0xffffffff;
              goto LAB_0010a4b7;
            }
            buffer_1._4_4_ = uVar3 * (uVar4 + 0xf & 0xfffffff0) * 4;
          }
          else {
            buffer_1._4_4_ = uVar3 * (uVar4 + 0xf & 0xfffffff0) * 3;
          }
        }
        else {
          buffer_1._4_4_ = uVar3 * (uVar4 + 0xf & 0xfffffff0) * 3 >> 1;
        }
      }
      else {
        buffer_1._4_4_ = uVar3 * (uVar4 + 0xf & 0xfffffff0) * 3 >> 1;
      }
      if (buffer_1._4_4_ != 0) {
        meta = (MppMeta)0x0;
        height = mpp_buffer_get_with_tag
                           (this->memGroup,&meta,buffer_1._4_4_,"vpu_api_legacy","encoder_sendframe"
                           );
        if (height != 0) {
          _mpp_log_l(2,"vpu_api_legacy","allocate input picture buffer failed\n","encoder_sendframe"
                    );
          goto LAB_0010a4b7;
        }
        dst = (RK_U8 *)mpp_buffer_get_ptr_with_caller(meta,"encoder_sendframe");
        copy_align_raw_buffer_to_dest(dst,aEncInStrm->buf,width_00,height_00,this->format);
        mpp_frame_set_buffer(inputCommit._32_8_,meta);
        mpp_buffer_put_with_caller(meta,"encoder_sendframe");
        meta = (MppMeta)0x0;
      }
    }
    else {
      memset(&buffer,0,0x28);
      buffer._0_4_ = 1;
      inputCommit._0_8_ = ZEXT48(uVar1);
      inputCommit.hnd._0_4_ = fd_00;
      if (uVar1 != 0) {
        uStack_88 = 0;
        height = mpp_buffer_import_with_tag
                           (0,&buffer,&stack0xffffffffffffff78,"vpu_api_legacy","encoder_sendframe")
        ;
        if (height != 0) {
          _mpp_log_l(2,"vpu_api_legacy","import input picture buffer failed\n","encoder_sendframe");
          goto LAB_0010a4b7;
        }
        mpp_frame_set_buffer(inputCommit._32_8_,uStack_88);
        mpp_buffer_put_with_caller(uStack_88,"encoder_sendframe");
        uStack_88 = 0;
      }
    }
  }
  if ((vpu_api_debug & 0x10) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","w %d h %d input fd %d size %d pts %lld, flag %d \n",
               "encoder_sendframe",width_00,height_00,fd_00,uVar1,aEncInStrm->timeUs,
               aEncInStrm->nFlags);
  }
  if (this->mlvec != (VpuApiMlvec)0x0) {
    meta_00 = (MppMeta)mpp_frame_get_meta(inputCommit._32_8_);
    vpu_api_mlvec_set_dy_cfg(this->mlvec,&this->mlvec_dy_cfg,meta_00);
  }
  height = (*this->mpi->encode_put_frame)(this->mpp_ctx,(MppFrame)inputCommit._32_8_);
  if (height == MPP_OK) {
    aEncInStrm->size = 0;
  }
  else {
    _mpp_log_l(2,"vpu_api_legacy","encode_put_frame ret %d\n","encoder_sendframe",height);
  }
LAB_0010a4b7:
  if (inputCommit._32_8_ != 0) {
    mpp_frame_deinit(&inputCommit.fd);
  }
  if ((vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","leave ret %d\n","encoder_sendframe",height);
  }
  return height;
}

Assistant:

RK_S32 VpuApiLegacy::encoder_sendframe(VpuCodecContext *ctx, EncInputStream_t *aEncInStrm)
{
    RK_S32 ret = 0;
    vpu_api_dbg_func("enter\n");

    RK_U32 width        = ctx->width;
    RK_U32 height       = ctx->height;
    RK_U32 hor_stride   = MPP_ALIGN(width,  16);
    RK_U32 ver_stride   = MPP_ALIGN(height, 8);
    RK_S64 pts          = aEncInStrm->timeUs;
    RK_S32 fd           = aEncInStrm->bufPhyAddr;
    RK_U32 size         = aEncInStrm->size;

    /* try import input buffer and output buffer */
    MppFrame frame = NULL;

    ret = mpp_frame_init(&frame);
    if (MPP_OK != ret) {
        mpp_err_f("mpp_frame_init failed\n");
        goto FUNC_RET;
    }

    mpp_frame_set_width(frame, width);
    mpp_frame_set_height(frame, height);
    mpp_frame_set_ver_stride(frame, ver_stride);
    mpp_frame_set_pts(frame, pts);
    switch (format & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420P :
    case MPP_FMT_YUV420SP :
    case MPP_FMT_YUV420SP_VU : {
        mpp_frame_set_hor_stride(frame, hor_stride);
    } break;
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555: {
        mpp_frame_set_hor_stride(frame, hor_stride * 2);
    } break;
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        mpp_frame_set_hor_stride(frame, hor_stride * 3);
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        mpp_frame_set_hor_stride(frame, hor_stride * 4);
    } break;
    default: {
        mpp_err("unsupport format 0x%x\n", format & MPP_FRAME_FMT_MASK);
    } break;
    }
    mpp_frame_set_fmt(frame, (MppFrameFormat)(format & MPP_FRAME_FMT_MASK));
    if (aEncInStrm->nFlags) {
        mpp_log_f("found eos true\n");
        mpp_frame_set_eos(frame, 1);
    }

    if (size <= 0) {
        mpp_frame_set_buffer(frame, NULL);
        if (!aEncInStrm->nFlags)
            mpp_err_f("found empty frame without eos flag set!\n");
        goto PUT_FRAME;
    }

    if (fd_input < 0) {
        fd_input = is_valid_dma_fd(fd);
    }
    if (fd_input) {
        MppBufferInfo   inputCommit;

        memset(&inputCommit, 0, sizeof(inputCommit));
        inputCommit.type = MPP_BUFFER_TYPE_ION;
        inputCommit.size = size;
        inputCommit.fd = fd;
        if (size > 0) {
            MppBuffer buffer = NULL;
            ret = mpp_buffer_import(&buffer, &inputCommit);
            if (ret) {
                mpp_err_f("import input picture buffer failed\n");
                goto FUNC_RET;
            }
            mpp_frame_set_buffer(frame, buffer);
            mpp_buffer_put(buffer);
            buffer = NULL;
        }
    } else {
        RK_U32 align_size   = 0;

        if (NULL == aEncInStrm->buf) {
            ret = MPP_ERR_NULL_PTR;
            goto FUNC_RET;
        }
        if (format >= MPP_FMT_YUV420SP && format < MPP_FMT_YUV_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3 / 2;
        } else  if (format >= MPP_FMT_YUV420SP_VU && format < MPP_FMT_YUV_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3 / 2;
        } else if (format >= MPP_FMT_RGB565 && format < MPP_FMT_BGR888) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3;
        } else if (format >= MPP_FMT_RGB101010 && format < MPP_FMT_RGB_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 4;
        } else {
            mpp_err_f("unsupport input format:%d\n", format);
            ret = MPP_NOK;
            goto FUNC_RET;
        }
        if (align_size > 0) {
            MppBuffer buffer = NULL;
            ret = mpp_buffer_get(memGroup, &buffer, align_size);
            if (ret) {
                mpp_err_f("allocate input picture buffer failed\n");
                goto FUNC_RET;
            }
            copy_align_raw_buffer_to_dest((RK_U8 *)mpp_buffer_get_ptr(buffer),
                                          aEncInStrm->buf, width, height, format);
            mpp_frame_set_buffer(frame, buffer);
            mpp_buffer_put(buffer);
            buffer = NULL;
        }
    }

PUT_FRAME:

    vpu_api_dbg_input("w %d h %d input fd %d size %d pts %lld, flag %d \n",
                      width, height, fd, size, aEncInStrm->timeUs, aEncInStrm->nFlags);
    if (mlvec) {
        MppMeta meta = mpp_frame_get_meta(frame);

        vpu_api_mlvec_set_dy_cfg(mlvec, &mlvec_dy_cfg, meta);
    }

    ret = mpi->encode_put_frame(mpp_ctx, frame);
    if (ret)
        mpp_err_f("encode_put_frame ret %d\n", ret);
    else
        aEncInStrm->size = 0;

FUNC_RET:
    if (frame)
        mpp_frame_deinit(&frame);

    vpu_api_dbg_func("leave ret %d\n", ret);
    return ret;
}